

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O3

bool __thiscall crnlib::cfile_stream::flush(cfile_stream *this)

{
  undefined1 *puVar1;
  int iVar2;
  
  if (((this->super_data_stream).field_0x1a & 1) == 0) {
    return false;
  }
  if (((this->super_data_stream).m_attribs & 2) != 0) {
    iVar2 = fflush((FILE *)this->m_pFile);
    if (iVar2 != -1) {
      return true;
    }
    puVar1 = &(this->super_data_stream).field_0x1a;
    *puVar1 = *puVar1 | 2;
  }
  return false;
}

Assistant:

virtual bool flush()
        {
            if ((!m_opened) || (!is_writable()))
            {
                return false;
            }

            if (EOF == fflush(m_pFile))
            {
                set_error();
                return false;
            }

            return true;
        }